

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HammeringPattern.cpp
# Opt level: O2

string * __thiscall
HammeringPattern::get_pattern_text_repr_abi_cxx11_
          (string *__return_storage_ptr__,HammeringPattern *this)

{
  string *psVar1;
  uint uVar2;
  ostream *this_00;
  reference pvVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong __n;
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0;
  string *local_38;
  
  local_38 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1c0);
  if ((ulong)(((long)(this->agg_access_patterns).
                     super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->agg_access_patterns).
                    super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x30) < 3) {
    uVar5 = 2;
  }
  else {
    uVar2 = get_num_digits((long)(this->aggressors).
                                 super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(this->aggressors).
                                 super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2);
    uVar5 = (ulong)uVar2;
  }
  for (__n = 0; psVar1 = local_38,
      __n < (ulong)((long)(this->aggressors).
                          super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(this->aggressors).
                          super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2); __n = __n + 1) {
    if ((__n != 0) && (__n % (ulong)(long)this->base_period == 0)) {
      std::endl<char,std::char_traits<char>>(&local_1b0);
    }
    this_00 = (ostream *)std::operator<<(&local_1b0,0x30);
    *(ulong *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x10) = uVar5;
    pvVar3 = std::vector<Aggressor,_std::allocator<Aggressor>_>::at(&this->aggressors,__n);
    poVar4 = (ostream *)std::ostream::operator<<(this_00,pvVar3->id);
    std::operator<<(poVar4," ");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return psVar1;
}

Assistant:

std::string HammeringPattern::get_pattern_text_repr() {
  std::stringstream ss;
  // depending on the number of aggressors, decide how many digits to use to represent each aggressor ID
  // we assume that if we have more than two AggressorAccessPatterns, then it is fully filled pattern and we can just
  // use the number of aggressors as a way to determine how many digits we need, otherwise it's probably a
  // empty/prefilled pattern and we assume 2 digits (as ID_PLACEHOLDER_AGG is -1)
  auto dwidth = (agg_access_patterns.size() > 2) ? get_num_digits(aggressors.size()) : 2;
  for (size_t i = 0; i < aggressors.size(); ++i) {
    // add a new line after each base period to make it easier to check a pattern's correctness
    if ((i%base_period)==0 && i > 0) ss << std::endl;
    ss << std::setfill('0') << std::setw(dwidth) << aggressors.at(i).id << " ";
  }
  return ss.str();
}